

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O0

int duckdb::DecimalToString::DecimalLength<int>(int value,uint8_t width,uint8_t scale)

{
  int iVar1;
  int iVar2;
  byte in_DL;
  byte in_SIL;
  int in_EDI;
  int extra_characters;
  undefined2 in_stack_fffffffffffffff4;
  int local_4;
  
  iVar2 = CONCAT13(in_SIL,CONCAT12(in_DL,in_stack_fffffffffffffff4));
  if (in_DL == 0) {
    local_4 = NumericHelper::SignedLength<int,_unsigned_int>(iVar2);
  }
  else {
    iVar1 = 1;
    if (in_DL < in_SIL) {
      iVar1 = 2;
    }
    iVar2 = NumericHelper::SignedLength<int,_unsigned_int>(iVar2);
    local_4 = MaxValue<int>((uint)in_DL + iVar1 + (uint)(in_EDI < 0),iVar2 + 1);
  }
  return local_4;
}

Assistant:

static int DecimalLength(SIGNED value, uint8_t width, uint8_t scale) {
		using UNSIGNED = typename MakeUnsigned<SIGNED>::type;
		if (scale == 0) {
			// scale is 0: regular number
			return NumericHelper::SignedLength<SIGNED, UNSIGNED>(value);
		}
		// length is max of either:
		// scale + 2 OR
		// integer length + 1
		// scale + 2 happens when the number is in the range of (-1, 1)
		// in that case we print "0.XXX", which is the scale, plus "0." (2 chars)
		// integer length + 1 happens when the number is outside of that range
		// in that case we print the integer number, but with one extra character ('.')
		auto extra_characters = width > scale ? 2 : 1;
		return MaxValue(scale + extra_characters + (value < 0 ? 1 : 0),
		                NumericHelper::SignedLength<SIGNED, UNSIGNED>(value) + 1);
	}